

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGraphBenchmark.cpp
# Opt level: O3

void __thiscall
RandomGraphBenchmark::run(RandomGraphBenchmark *this,unsigned_long deletions,unsigned_long queries)

{
  ostream *poVar1;
  invalid_argument *this_00;
  double dVar2;
  double extraout_XMM0_Qa;
  
  if (deletions <=
      (this->super_Benchmark).G.super_UndirectedGraph.super_type.m_edges.
      super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
      ._M_impl._M_node._M_size) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[i] random graph initialization time: ",0x26);
    *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) &
         0xfffffefb | 4;
    dVar2 = Benchmark::getInitTime(&this->super_Benchmark);
    std::ostream::_M_insert<double>(dVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," seconds (",10);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," vertices ",10);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," edges)",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[i] random graph deletion time: ",0x20);
    *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) &
         0xfffffefb | 4;
    (**(this->super_Benchmark)._vptr_Benchmark)(this,deletions);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," seconds (",10);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," deletions)",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[i] random graph query time: ",0x1d);
    *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) &
         0xfffffefb | 4;
    dVar2 = Benchmark::getQueryTime(&this->super_Benchmark,queries);
    std::ostream::_M_insert<double>(dVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," seconds (",10);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," queries)",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"RandomGraphBenchmark: Too many deletions");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void RandomGraphBenchmark::run(unsigned long deletions, unsigned long queries)
{
    if (deletions > num_edges(G)) {
        throw std::invalid_argument("RandomGraphBenchmark: Too many deletions");
    }

    std::cout << "[i] random graph initialization time: " << std::fixed << this->getInitTime();
    std::cout << " seconds (" << num_vertices(G) << " vertices " << num_edges(G) << " edges)" << std::endl;
    std::cout << "[i] random graph deletion time: " << std::fixed << this->getDeletionsTime(deletions);
    std::cout << " seconds (" << deletions << " deletions)" << std::endl;
    std::cout << "[i] random graph query time: " << std::fixed << this->getQueryTime(queries);
    std::cout << " seconds (" << queries << " queries)" << std::endl;
}